

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NeuralNetworkClassifier::ByteSizeLong(NeuralNetworkClassifier *this)

{
  bool bVar1;
  uint uVar2;
  NeuralNetworkMultiArrayShapeMapping NVar3;
  NeuralNetworkImageShapeMapping NVar4;
  ClassLabelsCase CVar5;
  int iVar6;
  NeuralNetworkLayer *value;
  size_t sVar7;
  NeuralNetworkPreprocessing *value_00;
  long lVar8;
  string *value_01;
  uint local_28;
  int cached_size;
  uint i_1;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  NeuralNetworkClassifier *this_local;
  
  uVar2 = layers_size(this);
  _i = (size_t)uVar2;
  for (i_1 = 0; i_1 < uVar2; i_1 = i_1 + 1) {
    value = layers(this,i_1);
    sVar7 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkLayer>(value);
    _i = sVar7 + _i;
  }
  uVar2 = preprocessing_size(this);
  _i = uVar2 + _i;
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    value_00 = preprocessing(this,local_28);
    sVar7 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkPreprocessing>(value_00);
    _i = sVar7 + _i;
  }
  labelprobabilitylayername_abi_cxx11_(this);
  lVar8 = std::__cxx11::string::size();
  if (lVar8 != 0) {
    value_01 = labelprobabilitylayername_abi_cxx11_(this);
    sVar7 = google::protobuf::internal::WireFormatLite::StringSize(value_01);
    _i = sVar7 + 2 + _i;
  }
  bVar1 = has_updateparams(this);
  if (bVar1) {
    sVar7 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NetworkUpdateParameters>
                      (this->updateparams_);
    _i = sVar7 + 1 + _i;
  }
  NVar3 = arrayinputshapemapping(this);
  if (NVar3 != RANK5_ARRAY_MAPPING) {
    NVar3 = arrayinputshapemapping(this);
    sVar7 = google::protobuf::internal::WireFormatLite::EnumSize(NVar3);
    _i = sVar7 + 1 + _i;
  }
  NVar4 = imageinputshapemapping(this);
  if (NVar4 != RANK5_IMAGE_MAPPING) {
    NVar4 = imageinputshapemapping(this);
    sVar7 = google::protobuf::internal::WireFormatLite::EnumSize(NVar4);
    _i = sVar7 + 1 + _i;
  }
  CVar5 = ClassLabels_case(this);
  if (CVar5 != CLASSLABELS_NOT_SET) {
    if (CVar5 == kStringClassLabels) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      _i = sVar7 + 2 + _i;
    }
    else if (CVar5 == kInt64ClassLabels) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      _i = sVar7 + 2 + _i;
    }
  }
  iVar6 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar6;
  return _i;
}

Assistant:

size_t NeuralNetworkClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkClassifier)
  size_t total_size = 0;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  {
    unsigned int count = this->preprocessing_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->preprocessing(i));
    }
  }

  // string labelProbabilityLayerName = 200;
  if (this->labelprobabilitylayername().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->labelprobabilitylayername());
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updateparams_);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->arrayinputshapemapping());
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->imageinputshapemapping());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}